

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

stShareStack_t * co_alloc_sharestack(int count,int stack_size)

{
  stShareStack_t *psVar1;
  stStackMem_t **ppsVar2;
  stStackMem_t *psVar3;
  char *pcVar4;
  ulong uVar5;
  
  psVar1 = (stShareStack_t *)malloc(0x18);
  psVar1->alloc_idx = 0;
  psVar1->stack_size = stack_size;
  psVar1->count = count;
  ppsVar2 = (stStackMem_t **)calloc((long)count,8);
  if (0 < count) {
    uVar5 = 0;
    do {
      psVar3 = (stStackMem_t *)malloc(0x20);
      psVar3->occupy_co = (stCoRoutine_t *)0x0;
      psVar3->stack_size = stack_size;
      pcVar4 = (char *)malloc((ulong)(uint)stack_size);
      psVar3->stack_buffer = pcVar4;
      psVar3->stack_bp = pcVar4 + (uint)stack_size;
      ppsVar2[uVar5] = psVar3;
      uVar5 = uVar5 + 1;
    } while ((uint)count != uVar5);
  }
  psVar1->stack_array = ppsVar2;
  return psVar1;
}

Assistant:

stShareStack_t* co_alloc_sharestack(int count, int stack_size)
{
	stShareStack_t* share_stack = (stShareStack_t*)malloc(sizeof(stShareStack_t));
	share_stack->alloc_idx = 0;
	share_stack->stack_size = stack_size;

	//alloc stack array
	share_stack->count = count;
	stStackMem_t** stack_array = (stStackMem_t**)calloc(count, sizeof(stStackMem_t*));
	for (int i = 0; i < count; i++)
	{
		stack_array[i] = co_alloc_stackmem(stack_size);
	}
	share_stack->stack_array = stack_array;
	return share_stack;
}